

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O0

lua_Integer luaV_idiv(CompilerState *compiler_state,lua_Integer m,lua_Integer n)

{
  CompilerState *local_30;
  lua_Integer q;
  lua_Integer n_local;
  lua_Integer m_local;
  CompilerState *compiler_state_local;
  
  if (n + 1U < 2) {
    if (n == 0) {
      handle_error(compiler_state,"attempt to divide by zero");
    }
    compiler_state_local = (CompilerState *)-m;
  }
  else {
    local_30 = (CompilerState *)(m / n);
    if (((m ^ n) < 0) && (m % n != 0)) {
      local_30 = (CompilerState *)((long)&local_30[-1]._ENV + 7);
    }
    compiler_state_local = local_30;
  }
  return (lua_Integer)compiler_state_local;
}

Assistant:

static lua_Integer luaV_idiv(CompilerState *compiler_state, lua_Integer m, lua_Integer n)
{
	if (unlikely(l_castS2U(n) + 1u <= 1u)) { /* special cases: -1 or 0 */
		if (n == 0)
			handle_error(compiler_state, "attempt to divide by zero");
		return 0 - m; /* n==-1; avoid overflow with 0x80000...//-1 */
	} else {
		lua_Integer q = m / n;	       /* perform C division */
		if ((m ^ n) < 0 && m % n != 0) /* 'm/n' would be negative non-integer? */
			q -= 1;		       /* correct result for different rounding */
		return q;
	}
}